

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

ssize_t __thiscall
GGSock::Communicator::send(Communicator *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Head_base<0UL,_GGSock::Communicator::Data_*,_false> this_00;
  bool bVar1;
  undefined7 extraout_var;
  ulong uVar2;
  TBufferSize size;
  string msg;
  undefined2 local_4e;
  int local_4c;
  string local_48;
  
  local_4e = (undefined2)__fd;
  this_00._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<GGSock::Communicator::Data,_std::default_delete<GGSock::Communicator::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::Communicator::Data_*,_std::default_delete<GGSock::Communicator::Data>_>
       .super__Head_base<0UL,_GGSock::Communicator::Data_*,_false>._M_head_impl;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)&(this_00._M_head_impl)->mutexSend)->__data);
  if ((this_00._M_head_impl)->isConnected == false) {
    uVar2 = 0;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_4c = (int)__n + 6;
    std::__cxx11::string::reserve((ulong)&local_48);
    std::__cxx11::string::append<char_const*,void>
              ((string *)&local_48,(char *)&local_4c,(char *)&local_48);
    std::__cxx11::string::append<char_const*,void>
              ((string *)&local_48,(char *)&local_4e,(char *)&local_4c);
    std::__cxx11::string::append<char_const*,void>
              ((string *)&local_48,(char *)__buf,(char *)((__n & 0xffffffff) + (long)__buf));
    bVar1 = Data::addMessageToSend(this_00._M_head_impl,&local_48);
    uVar2 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
    std::__cxx11::string::~string((string *)&local_48);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&(this_00._M_head_impl)->mutexSend);
  return uVar2;
}

Assistant:

bool Communicator::send(TMessageType type, const char * dataBuffer, TBufferSize dataSize) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutexSend);

        if (data.isConnected == false) return false;

        {
            std::string msg;
            TBufferSize size = ::MessageHeader::getSizeInBytes() + dataSize;

            msg.reserve(size);

            msg.append(reinterpret_cast<const char*>(&size), reinterpret_cast<const char*>(&size)+sizeof(size));
            msg.append(reinterpret_cast<const char*>(&type), reinterpret_cast<const char*>(&type)+sizeof(type));
            msg.append(dataBuffer, dataBuffer + dataSize);

            if (data.addMessageToSend(std::move(msg)) == false) {
                // error, send buffer is full
                return false;
            }
        }

        return true;
    }